

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

int PyxmlNodeSet_Convert(PyObject *py_nodeset,xmlNodeSetPtr *result)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  xmlNodeSetPtr pxVar5;
  xmlNodePtr *__s;
  long lVar6;
  char *pcVar7;
  long lVar8;
  undefined8 uVar9;
  xmlNodePtr pxVar10;
  PyTypeObject **ppPVar11;
  uint uVar12;
  
  uVar2 = py_nodeset->ob_type->tp_flags;
  uVar12 = (uint)uVar2;
  if ((uVar2 & 0x6000000) == 0) {
    if (py_nodeset == (PyObject *)&_Py_NoneStruct) {
      *result = (xmlNodeSetPtr)0x0;
      return 0;
    }
    pcVar7 = "must be a tuple or list of nodes.";
    uVar9 = _PyExc_TypeError;
  }
  else {
    pxVar5 = (xmlNodeSetPtr)(*_xmlMalloc)(0x10);
    if (pxVar5 != (xmlNodeSetPtr)0x0) {
      pxVar5->nodeNr = 0;
      uVar3 = (uint)py_nodeset->ob_type->tp_flags;
      if ((uVar12 >> 0x1a & 1) == 0) {
        if ((uVar3 >> 0x19 & 1) == 0) {
          __assert_fail("PyList_Check(py_nodeset)",
                        "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                        ,0xca0,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
        }
      }
      else if ((uVar3 >> 0x1a & 1) == 0) {
        __assert_fail("PyTuple_Check(py_nodeset)",
                      "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                      ,0xc9f,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
      }
      iVar4 = (int)py_nodeset[1].ob_refcnt;
      pxVar5->nodeMax = iVar4;
      __s = (xmlNodePtr *)(*_xmlMalloc)((long)iVar4 << 3);
      pxVar5->nodeTab = __s;
      if (__s != (xmlNodePtr *)0x0) {
        memset(__s,0,(long)pxVar5->nodeMax << 3);
        iVar4 = pxVar5->nodeMax;
        if (0 < (long)iVar4) {
          lVar6 = 0;
          lVar8 = 0;
          do {
            uVar3 = (uint)py_nodeset->ob_type->tp_flags;
            if ((uVar12 >> 0x1a & 1) == 0) {
              if ((uVar3 >> 0x19 & 1) == 0) goto LAB_0013f2c1;
              ppPVar11 = (PyTypeObject **)
                         ((long)&((py_nodeset[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar6);
            }
            else {
              if ((uVar3 >> 0x1a & 1) == 0) goto LAB_0013f2e0;
              ppPVar11 = &py_nodeset[1].ob_type + lVar8;
            }
            if (*ppPVar11 == (PyTypeObject *)&_Py_NoneStruct) {
              pxVar10 = (xmlNodePtr)0x0;
            }
            else {
              uVar3 = (uint)py_nodeset->ob_type->tp_flags;
              if ((uVar12 >> 0x1a & 1) == 0) {
                if ((uVar3 >> 0x19 & 1) == 0) {
LAB_0013f2c1:
                  __assert_fail("PyList_Check(py_nodeset)",
                                "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                                ,0xcb2,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
                }
                ppPVar11 = (PyTypeObject **)
                           ((long)&((py_nodeset[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar6);
              }
              else {
                if ((uVar3 >> 0x1a & 1) == 0) {
LAB_0013f2e0:
                  __assert_fail("PyTuple_Check(py_nodeset)",
                                "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                                ,0xcb1,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
                }
                ppPVar11 = &py_nodeset[1].ob_type + lVar8;
              }
              pxVar10 = (xmlNodePtr)((*ppPVar11)->ob_base).ob_size;
            }
            if (pxVar10 != (xmlNodePtr)0x0) {
              iVar1 = pxVar5->nodeNr;
              pxVar5->nodeNr = iVar1 + 1;
              pxVar5->nodeTab[iVar1] = pxVar10;
            }
            lVar8 = lVar8 + 1;
            lVar6 = lVar6 + 8;
          } while ((long)iVar4 * 8 != lVar6);
        }
        *result = pxVar5;
        return 0;
      }
      (*_xmlFree)(pxVar5);
    }
    pcVar7 = "";
    uVar9 = _PyExc_MemoryError;
  }
  PyErr_SetString(uVar9,pcVar7);
  return -1;
}

Assistant:

static int
PyxmlNodeSet_Convert(PyObject *py_nodeset, xmlNodeSetPtr *result)
{
    xmlNodeSetPtr nodeSet;
    int is_tuple = 0;

    if (PyTuple_Check(py_nodeset))
        is_tuple = 1;
    else if (PyList_Check(py_nodeset))
        is_tuple = 0;
    else if (py_nodeset == Py_None) {
        *result = NULL;
        return 0;
    }
    else {
        PyErr_SetString(PyExc_TypeError,
                        "must be a tuple or list of nodes.");
        return -1;
    }

    nodeSet = (xmlNodeSetPtr) xmlMalloc(sizeof(xmlNodeSet));
    if (nodeSet == NULL) {
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }

    nodeSet->nodeNr = 0;
    nodeSet->nodeMax = (is_tuple
                        ? PyTuple_GET_SIZE(py_nodeset)
                        : PyList_GET_SIZE(py_nodeset));
    nodeSet->nodeTab
        = (xmlNodePtr *) xmlMalloc (nodeSet->nodeMax
                                    * sizeof(xmlNodePtr));
    if (nodeSet->nodeTab == NULL) {
        xmlFree(nodeSet);
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }
    memset(nodeSet->nodeTab, 0 ,
           nodeSet->nodeMax * sizeof(xmlNodePtr));

    {
        int idx;
        for (idx=0; idx < nodeSet->nodeMax; ++idx) {
            xmlNodePtr pynode =
                PyxmlNode_Get (is_tuple
                               ? PyTuple_GET_ITEM(py_nodeset, idx)
                               : PyList_GET_ITEM(py_nodeset, idx));
            if (pynode)
                nodeSet->nodeTab[nodeSet->nodeNr++] = pynode;
        }
    }
    *result = nodeSet;
    return 0;
}